

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

void deqp::gls::ub::anon_unknown_12::generateDeclaration
               (ostringstream *src,VarType *type,char *name,int indentLevel,deUint32 unusedHints)

{
  Type TVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  pointer piVar6;
  PrecisionFlagsFmt local_54;
  char *local_50;
  vector<int,_std::allocator<int>_> arraySizes;
  
  uVar2 = type->m_flags;
  if ((uVar2 & 0xf8) != 0) {
    poVar3 = std::operator<<((ostream *)src,"layout(");
    local_50 = (char *)CONCAT44(local_50._4_4_,indentLevel);
    arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(CONCAT44(arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,uVar2) & 0xffffffff000000f8
                        );
    ub::operator<<(poVar3,(LayoutFlagsFmt *)&arraySizes);
    indentLevel = (int)local_50;
    std::operator<<(poVar3,") ");
  }
  if ((uVar2 & 7) != 0) {
    arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(CONCAT44(arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,uVar2) & 0xffffffff00000007
                        );
    ub::operator<<((ostream *)src,(PrecisionFlagsFmt *)&arraySizes);
    std::operator<<((ostream *)src," ");
  }
  if (type->m_type == TYPE_ARRAY) {
    arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    TVar1 = TYPE_ARRAY;
    local_50 = name;
    while (pcVar4 = local_50, TVar1 == TYPE_ARRAY) {
      local_54.flags = (type->m_data).array.size;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&arraySizes,(int *)&local_54);
      type = (type->m_data).array.elementType;
      TVar1 = type->m_type;
    }
    if (TVar1 == TYPE_BASIC) {
      uVar2 = type->m_flags & 7;
      if (uVar2 != 0) {
        local_54.flags = uVar2;
        ub::operator<<((ostream *)src,&local_54);
        std::operator<<((ostream *)src," ");
      }
      pcVar5 = glu::getDataTypeName((type->m_data).basicType);
      std::operator<<((ostream *)src,pcVar5);
    }
    else {
      generateLocalDeclaration(src,(type->m_data).structPtr,indentLevel + 1);
      pcVar4 = local_50;
    }
    poVar3 = std::operator<<((ostream *)src," ");
    std::operator<<(poVar3,pcVar4);
    for (piVar6 = arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 != arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
      poVar3 = std::operator<<((ostream *)src,"[");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar6);
      std::operator<<(poVar3,"]");
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&arraySizes.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    if (type->m_type == TYPE_BASIC) {
      pcVar4 = glu::getDataTypeName((type->m_data).basicType);
      poVar3 = std::operator<<((ostream *)src,pcVar4);
    }
    else {
      generateLocalDeclaration(src,(type->m_data).structPtr,indentLevel + 1);
      poVar3 = (ostream *)src;
    }
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,name);
  }
  std::operator<<((ostream *)src,";");
  if (unusedHints != 0) {
    poVar3 = std::operator<<((ostream *)src," // unused in ");
    if (unusedHints == 0x400) {
      pcVar4 = "vertex shader";
    }
    else if (unusedHints == 0xc00) {
      pcVar4 = "both shaders";
    }
    else {
      pcVar4 = "???";
      if (unusedHints == 0x800) {
        pcVar4 = "fragment shader";
      }
    }
    std::operator<<(poVar3,pcVar4);
  }
  std::operator<<((ostream *)src,"\n");
  return;
}

Assistant:

void generateDeclaration (std::ostringstream& src, const VarType& type, const char* name, int indentLevel, deUint32 unusedHints)
{
	deUint32 flags = type.getFlags();

	if ((flags & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(flags & LAYOUT_MASK) << ") ";

	if ((flags & PRECISION_MASK) != 0)
		src << PrecisionFlagsFmt(flags & PRECISION_MASK) << " ";

	if (type.isBasicType())
		src << glu::getDataTypeName(type.getBasicType()) << " " << name;
	else if (type.isArrayType())
	{
		std::vector<int>	arraySizes;
		const VarType*		curType		= &type;
		while (curType->isArrayType())
		{
			arraySizes.push_back(curType->getArraySize());
			curType = &curType->getElementType();
		}

		if (curType->isBasicType())
		{
			if ((curType->getFlags() & PRECISION_MASK) != 0)
				src << PrecisionFlagsFmt(curType->getFlags() & PRECISION_MASK) << " ";
			src << glu::getDataTypeName(curType->getBasicType());
		}
		else
		{
			DE_ASSERT(curType->isStructType());
			generateLocalDeclaration(src, curType->getStruct(), indentLevel+1);
		}

		src << " " << name;

		for (std::vector<int>::const_iterator sizeIter = arraySizes.begin(); sizeIter != arraySizes.end(); sizeIter++)
			src << "[" << *sizeIter << "]";
	}
	else
	{
		generateLocalDeclaration(src, type.getStruct(), indentLevel+1);
		src << " " << name;
	}

	src << ";";

	// Print out unused hints.
	if (unusedHints != 0)
		src << " // unused in " << (unusedHints == UNUSED_BOTH		? "both shaders"	:
									unusedHints == UNUSED_VERTEX	? "vertex shader"	:
									unusedHints == UNUSED_FRAGMENT	? "fragment shader" : "???");

	src << "\n";
}